

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grow_one_util.cpp
# Opt level: O0

bool __thiscall
SMC::grow_one_with_sc
          (SMC *this,Structure *CurConf,int Position,int tmpEnd,int LoopChosen,Atom *EndPt)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined8 this_00;
  vector<double,_std::allocator<double>_> *this_01;
  allocator_type *__a;
  SMC *pSVar12;
  undefined1 p [8];
  int iVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  reference pvVar18;
  ostream *poVar19;
  void *pvVar20;
  vector<int,_std::allocator<int>_> *pvVar21;
  Residue *pRVar22;
  double (*angles) [6];
  double *torAngles;
  size_type sVar23;
  Atom *pAVar24;
  undefined1 *puVar25;
  void *__s;
  Residue *pRVar26;
  Atom *pAVar27;
  vector<int,_std::allocator<int>_> *pvVar28;
  vector<int,_std::allocator<int>_> *pvVar29;
  undefined8 uStack_1ee0;
  Point PStack_1ed8;
  Point PStack_1ec0;
  Point PStack_1ea8;
  Point PStack_1e90;
  undefined1 auStack_1e78 [128];
  ostream *local_1df8;
  ostream *local_1df0;
  ostream *local_1de8;
  ostream *local_1de0;
  undefined1 local_1dd1;
  double local_1dd0;
  vector<double,_std::allocator<double>_> *local_1dc8;
  undefined1 local_1db9;
  size_type local_1db8;
  allocator_type *local_1db0;
  double local_1d98;
  ulong local_1d90;
  void *local_1d88;
  Residue *local_1d80;
  Residue *local_1d78;
  Residue *local_1d70;
  ulong local_1d68;
  ulong local_1d60;
  Residue *local_1d58;
  long local_1d50;
  ulong local_1d48;
  undefined1 *local_1d40;
  undefined1 *local_1d38;
  double local_1d30;
  undefined1 *local_1d28;
  double local_1d20;
  bool local_1d11;
  double local_1d10;
  undefined1 local_1d01;
  undefined1 *local_1d00;
  SMC *local_1cf8;
  int local_1cec;
  Residue *pRStack_1ce8;
  int i_8;
  Residue *chosen_res;
  int local_1cd8;
  int chosen_j;
  int chosen_i;
  int chosen_scalar;
  int k_1;
  int j_3;
  int i_7;
  int k;
  int j_2;
  int i_6;
  double sum;
  value_type_conflict2 local_1ca8;
  undefined1 local_1ca0 [8];
  vector<double,_std::allocator<double>_> prob;
  int local_1c80;
  int j_1;
  int i_5;
  int candidate_key;
  double minE;
  unsigned_long __vla_expr6;
  unsigned_long __vla_expr5;
  unsigned_long __vla_expr4;
  unsigned_long __vla_expr3;
  int i_4;
  unsigned_long __vla_expr2;
  unsigned_long __vla_expr1;
  int j;
  int cur;
  int r_1;
  int i_3;
  int r;
  int i_2;
  int i_1;
  int Total;
  undefined1 local_1b10 [8];
  Residue sam;
  int local_19b8;
  int i;
  int deadlabel [160];
  int TorProb [160];
  int Psi [160];
  int Phi [160];
  double larbb_angles [160] [3];
  int LargeNumDistanceStates;
  double dStack_a0;
  int num_dead_labels;
  double maxEEDisN;
  double minEEDisN;
  double maxEEDisC;
  double minEEDisC;
  double dStack_78;
  int RemLength;
  double EEdisN;
  double EEdisC;
  ulong uStack_60;
  int binNum;
  unsigned_long __vla_expr0;
  int local_50;
  uint local_4c;
  int CurResType;
  int NumBBStates;
  int psi_int;
  int phi_int;
  Atom *EndPt_local;
  int local_30;
  int LoopChosen_local;
  int tmpEnd_local;
  int Position_local;
  Structure *CurConf_local;
  SMC *this_local;
  
  __vla_expr0 = (unsigned_long)auStack_1e78;
  local_4c = this->num_dist_states;
  local_50 = (int)CurConf->_res[Position]._type;
  uStack_60 = (ulong)local_4c;
  lVar17 = -(uStack_60 * 0x18 + 0xf & 0xfffffffffffffff0);
  EEdisC._4_4_ = 0x24;
  pAVar24 = CurConf->_res[Position]._atom;
  local_1d00 = auStack_1e78 + lVar17;
  local_1cf8 = this;
  *(undefined8 *)(auStack_1e78 + lVar17 + -8) = 0x16771c;
  _psi_int = EndPt;
  EndPt_local._4_4_ = LoopChosen;
  local_30 = tmpEnd;
  LoopChosen_local = Position;
  _tmpEnd_local = CurConf;
  CurConf_local = (Structure *)this;
  EEdisN = Point::dis(&pAVar24[1].super_Point,&EndPt->super_Point);
  dStack_78 = 0.0;
  minEEDisC._4_4_ = local_30 - LoopChosen_local;
  maxEEDisC = local_1cf8->minDistcon[1][minEEDisC._4_4_];
  minEEDisN = local_1cf8->DistconBy[1][minEEDisC._4_4_] * 31.0 +
              local_1cf8->minDistcon[1][minEEDisC._4_4_];
  maxEEDisN = local_1cf8->minDistcon[0][minEEDisC._4_4_ + -1];
  dStack_a0 = local_1cf8->DistconBy[0][minEEDisC._4_4_ + -1] * 31.0 +
              local_1cf8->minDistcon[0][minEEDisC._4_4_ + -1];
  LargeNumDistanceStates = 0;
  if ((EEdisN < maxEEDisC) || (minEEDisN < EEdisN)) {
    this_local._7_1_ = 0;
  }
  else {
    *(undefined8 *)(auStack_1e78 + lVar17 + -8) = 0x16782c;
    memset(&local_19b8,0,0x280);
    sam._center._state = 0;
    sam._center._78_2_ = 0;
    for (; (int)sam._center._76_4_ < 0xa0; sam._center._76_4_ = sam._center._76_4_ + 1) {
      *(undefined8 *)(auStack_1e78 + lVar17 + -8) = 0x167857;
      Residue::Residue((Residue *)local_1b10,0x1e);
      pSVar12 = local_1cf8;
      deadlabel[(long)(int)sam._center._76_4_ + 0x9e] = -1;
      pAVar24 = _tmpEnd_local->_res[LoopChosen_local]._atom;
      dVar1 = Residue::bond_angle[local_50][2];
      dVar2 = Residue::bond_length[local_50][2];
      pAVar27 = (Atom *)((long)local_1b10 + 0xa0);
      *(int *)(auStack_1e78 + lVar17 + -0x10) = minEEDisC._4_4_;
      *(undefined8 *)((long)&PStack_1e90 + lVar17) = 0x1678e5;
      sample_distance(pSVar12,pAVar24,pAVar24 + 1,_psi_int,dVar1,dVar2,pAVar27,EEdisN,1,
                      *(int *)(auStack_1e78 + lVar17 + -0x10));
      dVar1 = (((Atom *)((long)local_1b10 + 0xa0))->super_Point).x;
      lVar16 = (long)(int)sam._center._76_4_;
      *(undefined8 *)(auStack_1e78 + lVar17 + -8) = 0x16791d;
      local_1d01 = anon_unknown.dwarf_3db96::conditional_mark_dead_label
                             (dVar1,deadlabel + lVar16 + 0x9e,&local_19b8 + lVar16,
                              &LargeNumDistanceStates);
      if (!(bool)local_1d01) {
        pAVar24 = (Atom *)((long)local_1b10 + 0xa0);
        *(undefined8 *)(auStack_1e78 + lVar17 + -8) = 0x16797a;
        dStack_78 = Point::dis((Point *)pAVar24,&_psi_int->super_Point);
        p = local_1b10;
        pSVar12 = local_1cf8;
        local_1d10 = dStack_78;
        if ((dStack_78 < maxEEDisN) || (dStack_a0 < dStack_78)) {
          deadlabel[(long)(int)sam._center._76_4_ + 0x9e] = 0;
          (&local_19b8)[(int)sam._center._76_4_] = 1;
          LargeNumDistanceStates = LargeNumDistanceStates + 1;
        }
        else {
          pAVar24 = _tmpEnd_local->_res[LoopChosen_local]._atom;
          pAVar27 = (Atom *)((long)local_1b10 + 0xa0);
          dVar1 = Residue::bond_angle[local_50][0];
          dVar2 = Residue::bond_length[local_50][0];
          *(int *)(auStack_1e78 + lVar17 + -0x10) = minEEDisC._4_4_ + -1;
          *(undefined8 *)((long)&PStack_1e90 + lVar17) = 0x167a35;
          sample_distance(pSVar12,pAVar24 + 1,pAVar27,_psi_int,dVar1,dVar2,(Atom *)p,dStack_78,0,
                          *(int *)(auStack_1e78 + lVar17 + -0x10));
          dVar1 = ((Point *)local_1b10)->x;
          lVar16 = (long)(int)sam._center._76_4_;
          *(undefined8 *)(auStack_1e78 + lVar17 + -8) = 0x167aad;
          local_1d11 = anon_unknown.dwarf_3db96::conditional_mark_dead_label
                                 (dVar1,deadlabel + lVar16 + 0x9e,&local_19b8 + lVar16,
                                  &LargeNumDistanceStates);
          if (!local_1d11) {
            pAVar24 = _tmpEnd_local->_res[LoopChosen_local + -1]._atom;
            dVar1 = pAVar24[2].super_Point.z;
            dVar4 = pAVar24[2].super_Point.x;
            dVar5 = pAVar24[2].super_Point.y;
            pAVar24 = _tmpEnd_local->_res[LoopChosen_local]._atom;
            dVar2 = (pAVar24->super_Point).z;
            dVar6 = (pAVar24->super_Point).x;
            dVar7 = (pAVar24->super_Point).y;
            pAVar24 = _tmpEnd_local->_res[LoopChosen_local]._atom;
            dVar3 = pAVar24[1].super_Point.z;
            dVar8 = pAVar24[1].super_Point.x;
            dVar9 = pAVar24[1].super_Point.y;
            dVar10 = (((Atom *)((long)local_1b10 + 0xa0))->super_Point).x;
            dVar11 = (((Atom *)((long)local_1b10 + 0xa0))->super_Point).y;
            local_1d28 = (undefined1 *)((long)&PStack_1ed8 + lVar17);
            *(double *)(auStack_1e78 + lVar17 + -8) =
                 (((Atom *)((long)local_1b10 + 0xa0))->super_Point).z;
            *(double *)((long)&PStack_1e90 + lVar17) = dVar10;
            *(double *)(auStack_1e78 + lVar17 + -0x10) = dVar11;
            *(double *)((long)&PStack_1ea8 + lVar17 + 0x10) = dVar3;
            *(double *)((long)&PStack_1ea8 + lVar17) = dVar8;
            *(double *)((long)&PStack_1ea8 + lVar17 + 8) = dVar9;
            *(double *)((long)&PStack_1ec0 + lVar17 + 0x10) = dVar2;
            *(double *)((long)&PStack_1ec0 + lVar17) = dVar6;
            *(double *)((long)&PStack_1ec0 + lVar17 + 8) = dVar7;
            *(double *)((long)&PStack_1ed8 + lVar17 + 0x10) = dVar1;
            *(double *)((long)&PStack_1ed8 + lVar17) = dVar4;
            *(double *)((long)&PStack_1ed8 + lVar17 + 8) = dVar5;
            *(undefined8 *)((long)&uStack_1ee0 + lVar17) = 0x167bef;
            local_1d20 = torsion(*(Point *)((long)&PStack_1ed8 + lVar17),
                                 *(Point *)((long)&PStack_1ec0 + lVar17),
                                 *(Point *)((long)&PStack_1ea8 + lVar17),
                                 *(Point *)((long)&PStack_1e90 + lVar17),torsion_degrees);
            larbb_angles[(long)(int)sam._center._76_4_ + -1][2] = local_1d20;
            pAVar24 = _tmpEnd_local->_res[LoopChosen_local]._atom;
            dVar1 = (pAVar24->super_Point).z;
            dVar4 = (pAVar24->super_Point).x;
            dVar5 = (pAVar24->super_Point).y;
            pAVar24 = _tmpEnd_local->_res[LoopChosen_local]._atom;
            dVar2 = pAVar24[1].super_Point.z;
            dVar6 = pAVar24[1].super_Point.x;
            dVar7 = pAVar24[1].super_Point.y;
            dVar3 = (((Atom *)((long)local_1b10 + 0xa0))->super_Point).z;
            dVar8 = (((Atom *)((long)local_1b10 + 0xa0))->super_Point).x;
            dVar9 = (((Atom *)((long)local_1b10 + 0xa0))->super_Point).y;
            dVar10 = ((Point *)local_1b10)->x;
            dVar11 = ((Point *)local_1b10)->y;
            local_1d38 = (undefined1 *)((long)&PStack_1ed8 + lVar17);
            *(double *)(auStack_1e78 + lVar17 + -8) = ((Point *)local_1b10)->z;
            *(double *)((long)&PStack_1e90 + lVar17) = dVar10;
            *(double *)(auStack_1e78 + lVar17 + -0x10) = dVar11;
            *(double *)((long)&PStack_1ea8 + lVar17 + 0x10) = dVar3;
            *(double *)((long)&PStack_1ea8 + lVar17) = dVar8;
            *(double *)((long)&PStack_1ea8 + lVar17 + 8) = dVar9;
            *(double *)((long)&PStack_1ec0 + lVar17 + 0x10) = dVar2;
            *(double *)((long)&PStack_1ec0 + lVar17) = dVar6;
            *(double *)((long)&PStack_1ec0 + lVar17 + 8) = dVar7;
            *(double *)((long)&PStack_1ed8 + lVar17 + 0x10) = dVar1;
            *(double *)((long)&PStack_1ed8 + lVar17) = dVar4;
            *(double *)((long)&PStack_1ed8 + lVar17 + 8) = dVar5;
            *(undefined8 *)((long)&uStack_1ee0 + lVar17) = 0x167d1d;
            local_1d30 = torsion(*(Point *)((long)&PStack_1ed8 + lVar17),
                                 *(Point *)((long)&PStack_1ec0 + lVar17),
                                 *(Point *)((long)&PStack_1ea8 + lVar17),
                                 *(Point *)((long)&PStack_1e90 + lVar17),torsion_degrees);
            larbb_angles[(int)sam._center._76_4_][0] = local_1d30;
            lVar16 = (long)(int)sam._center._76_4_;
            *(undefined8 *)(auStack_1e78 + lVar17 + -8) = 0x167d6f;
            box_MullerNsample_single(larbb_angles[lVar16] + 1,3.14159265358979,0.06981317007977311);
            lVar16 = (long)(int)sam._center._76_4_;
            dVar1 = larbb_angles[lVar16][1];
            *(undefined8 *)(auStack_1e78 + lVar17 + -8) = 0x167da1;
            anon_unknown.dwarf_3db96::conditional_mark_dead_label
                      (dVar1,deadlabel + lVar16 + 0x9e,&local_19b8 + lVar16,&LargeNumDistanceStates)
            ;
          }
        }
      }
      *(undefined8 *)(auStack_1e78 + lVar17 + -8) = 0x167db9;
      Residue::~Residue((Residue *)local_1b10);
    }
    if (LargeNumDistanceStates == 0xa0) {
      this_local._7_1_ = 0;
    }
    else {
      i_2 = 0;
      for (r = 0; r < 0xa0; r = r + 1) {
        if (deadlabel[(long)r + 0x9e] == -1) {
          iVar13 = (int)(larbb_angles[(long)r + -1][2] / 5.0);
          NumBBStates = iVar13 + 0x24;
          iVar14 = (int)(larbb_angles[r][0] / 5.0);
          CurResType = iVar14 + 0x24;
          if ((larbb_angles[(long)r + -1][2] / 5.0 + 36.0) - (double)NumBBStates < 0.0) {
            NumBBStates = iVar13 + 0x23;
          }
          if ((larbb_angles[r][0] / 5.0 + 36.0) - (double)CurResType < 0.0) {
            CurResType = iVar14 + 0x23;
          }
          Psi[(long)r + 0x9e] = NumBBStates;
          TorProb[(long)r + 0x9e] = CurResType;
          deadlabel[(long)r + 0x9e] = local_1cf8->Joint_Angle[local_50][NumBBStates][CurResType];
          i_2 = deadlabel[(long)r + 0x9e] + i_2;
        }
      }
      if ((i_2 == 0) || ((local_1cf8->use_rot_lib & 1U) == 0)) {
        for (i_3 = 0; i_3 < (int)local_4c; i_3 = i_3 + 1) {
          *(undefined8 *)(auStack_1e78 + lVar17 + -8) = 0x167ff9;
          iVar13 = rand();
          while (r_1 = iVar13 % 0xa0, (&local_19b8)[r_1] == 1) {
            iVar13 = r_1 + 1;
          }
          *(undefined8 *)(auStack_1e78 + lVar17 + -8) = 0x16803a;
          iVar13 = rand();
          *(double *)(local_1d00 + (long)i_3 * 0x18) =
               (((double)iVar13 + 0.5) / 2147483647.0) *
               (((double)(Psi[(long)r_1 + 0x9e] + -0x23) * 3.14159265358979) / 36.0 -
               ((double)(Psi[(long)r_1 + 0x9e] + -0x24) * 3.14159265358979) / 36.0) +
               ((double)(Psi[(long)r_1 + 0x9e] + -0x24) * 3.14159265358979) / 36.0;
          *(undefined8 *)(auStack_1e78 + lVar17 + -8) = 0x16810c;
          iVar13 = rand();
          *(double *)(local_1d00 + (long)i_3 * 0x18 + 8) =
               (((double)iVar13 + 0.5) / 2147483647.0) *
               (((double)(TorProb[(long)r_1 + 0x9e] + -0x23) * 3.14159265358979) / 36.0 -
               ((double)(TorProb[(long)r_1 + 0x9e] + -0x24) * 3.14159265358979) / 36.0) +
               ((double)(TorProb[(long)r_1 + 0x9e] + -0x24) * 3.14159265358979) / 36.0;
          *(double *)(local_1d00 + (long)i_3 * 0x18 + 0x10) = larbb_angles[r_1][1];
        }
      }
      else {
        for (cur = 0; cur < (int)local_4c; cur = cur + 1) {
          *(undefined8 *)(auStack_1e78 + lVar17 + -8) = 0x168241;
          iVar13 = rand();
          __vla_expr1._4_4_ = 0;
          for (__vla_expr1._0_4_ = 0; (int)__vla_expr1 < 0xa0;
              __vla_expr1._0_4_ = (int)__vla_expr1 + 1) {
            __vla_expr1._4_4_ = deadlabel[(long)(int)__vla_expr1 + 0x9e] + __vla_expr1._4_4_;
            if (iVar13 % i_2 < __vla_expr1._4_4_) {
              *(undefined8 *)(auStack_1e78 + lVar17 + -8) = 0x1682a3;
              iVar13 = rand();
              *(double *)(local_1d00 + (long)cur * 0x18) =
                   (((double)iVar13 + 0.5) / 2147483647.0) *
                   (((double)(Psi[(long)(int)__vla_expr1 + 0x9e] + -0x23) * 3.14159265358979) / 36.0
                   - ((double)(Psi[(long)(int)__vla_expr1 + 0x9e] + -0x24) * 3.14159265358979) /
                     36.0) + ((double)(Psi[(long)(int)__vla_expr1 + 0x9e] + -0x24) *
                             3.14159265358979) / 36.0;
              *(undefined8 *)(auStack_1e78 + lVar17 + -8) = 0x168375;
              iVar13 = rand();
              *(double *)(local_1d00 + (long)cur * 0x18 + 8) =
                   (((double)iVar13 + 0.5) / 2147483647.0) *
                   (((double)(TorProb[(long)(int)__vla_expr1 + 0x9e] + -0x23) * 3.14159265358979) /
                    36.0 - ((double)(TorProb[(long)(int)__vla_expr1 + 0x9e] + -0x24) *
                           3.14159265358979) / 36.0) +
                   ((double)(TorProb[(long)(int)__vla_expr1 + 0x9e] + -0x24) * 3.14159265358979) /
                   36.0;
              *(double *)(local_1d00 + (long)cur * 0x18 + 0x10) = larbb_angles[(int)__vla_expr1][1];
              break;
            }
          }
        }
      }
      local_1d48 = (ulong)(uint)local_1cf8->num_sc_states;
      puVar25 = auStack_1e78 + lVar17 + local_4c * local_1d48 * -0x30;
      iVar13 = local_1cf8->num_sc_states;
      local_1d40 = puVar25;
      *(undefined8 *)(puVar25 + -8) = 0x16850f;
      memset(puVar25,0,(long)(int)(local_4c * iVar13 * 6) << 3);
      for (__vla_expr3._4_4_ = 0; __vla_expr3._4_4_ < (int)local_4c;
          __vla_expr3._4_4_ = __vla_expr3._4_4_ + 1) {
        pRVar22 = _tmpEnd_local->_res;
        angles = (double (*) [6])(local_1d40 + (long)__vla_expr3._4_4_ * local_1d48 * 0x30);
        iVar13 = local_1cf8->num_sc_states;
        iVar14 = local_1cf8->ang_type;
        *(undefined8 *)(puVar25 + -8) = 0x168572;
        sample_sc_angles(pRVar22 + LoopChosen_local,angles,iVar13,iVar14);
      }
      local_1d68 = (ulong)local_4c;
      local_1d60 = (ulong)(uint)local_1cf8->num_sc_states;
      pRVar22 = (Residue *)(puVar25 + local_1d68 * local_1d60 * -0x150);
      local_1d50 = local_1d68 * local_1d60;
      local_1d58 = pRVar22;
      if (local_1d50 != 0) {
        local_1d78 = pRVar22 + local_1d50;
        local_1d70 = pRVar22;
        do {
          pRVar26 = local_1d70;
          local_1d80 = local_1d70;
          pRVar22[-1]._center._posn = 0x16861f;
          pRVar22[-1]._center._state = 0;
          *(undefined2 *)&pRVar22[-1]._center.field_0x4e = 0;
          Residue::Residue(pRVar26,0x1e);
          local_1d70 = local_1d80 + 1;
        } while (local_1d70 != local_1d78);
      }
      local_1d90 = (ulong)(uint)local_1cf8->num_sc_states;
      __s = (void *)((long)pRVar22 - (local_4c * local_1d90 * 8 + 0xf & 0xfffffffffffffff0));
      iVar13 = local_1cf8->num_sc_states;
      local_1d88 = __s;
      *(undefined8 *)((long)__s + -8) = 0x1686ae;
      memset(__s,0,(long)(int)(local_4c * iVar13) << 3);
      *(undefined8 *)((long)__s + -8) = 0x1686b3;
      _i_5 = std::numeric_limits<double>::max();
      j_1 = 0;
      for (local_1c80 = 0; local_1c80 < (int)local_4c; local_1c80 = local_1c80 + 1) {
        for (prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
            prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage._4_4_ < local_1cf8->num_sc_states;
            prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage._4_4_ =
                 prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
          pRVar22 = _tmpEnd_local->_res;
          pRVar26 = local_1d58 +
                    (long)local_1c80 * local_1d60 +
                    (long)prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._4_4_;
          *(undefined8 *)((long)__s + -8) = 0x168750;
          Residue::operator=(pRVar26,pRVar22 + LoopChosen_local);
          local_1d58
          [(long)local_1c80 * local_1d60 +
           (long)prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_]._phi =
               *(double *)(local_1d00 + (long)local_1c80 * 0x18);
          local_1d58
          [(long)local_1c80 * local_1d60 +
           (long)prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_]._psi =
               *(double *)(local_1d00 + (long)local_1c80 * 0x18 + 8);
          local_1d58
          [(long)local_1c80 * local_1d60 +
           (long)prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_]._omega =
               *(double *)(local_1d00 + (long)local_1c80 * 0x18 + 0x10);
          lVar17 = (long)local_1c80 * local_1d60;
          lVar16 = (long)prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_;
          pRVar22 = local_1d58 + lVar17 + lVar16;
          dVar1 = local_1d58[lVar17 + lVar16]._phi;
          dVar2 = local_1d58[lVar17 + lVar16]._psi;
          dVar3 = local_1d58[lVar17 + lVar16]._omega;
          *(undefined8 *)((long)__s + -8) = 0x16884f;
          Structure::calBBCo(_tmpEnd_local,LoopChosen_local,pRVar22,dVar1,dVar2,dVar3);
          torAngles = (double *)
                      (local_1d40 +
                      (long)prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_ * 0x30 +
                      (long)local_1c80 * local_1d48 * 0x30);
          pRVar22 = local_1d58 +
                    (long)local_1c80 * local_1d60 +
                    (long)prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._4_4_;
          *(undefined8 *)((long)__s + -8) = 0x1688b9;
          Structure::calSCCo(_tmpEnd_local,torAngles,pRVar22);
          pRVar22 = local_1d58 +
                    (long)local_1c80 * local_1d60 +
                    (long)prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._4_4_;
          *(undefined8 *)((long)__s + -8) = 0x1688fa;
          Structure::SinglecalCenter(_tmpEnd_local,pRVar22,0);
          puVar25 = &local_1cf8->field_0xe3498;
          pRVar22 = local_1d58 +
                    (long)local_1c80 * local_1d60 +
                    (long)prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._4_4_;
          pvVar21 = &local_1cf8->Reslist;
          pvVar28 = &local_1cf8->starts;
          pvVar29 = &local_1cf8->ends;
          *(int *)((long)__s + -8) = EndPt_local._4_4_;
          *(vector<int,_std::allocator<int>_> **)((long)__s + -0x18) = pvVar29;
          *(vector<int,_std::allocator<int>_> **)((long)__s + -0x20) = pvVar28;
          *(undefined4 *)((long)__s + -0x10) = 1;
          *(undefined8 *)((long)__s + -0x28) = 0x16898b;
          local_1d98 = PotentialFrontend::one_res_en_all_list
                                 ((PotentialFrontend *)puVar25,_tmpEnd_local,pRVar22,pvVar21,
                                  LoopChosen_local,j_1,
                                  *(vector<int,_std::allocator<int>_> **)((long)__s + -0x20),
                                  *(vector<int,_std::allocator<int>_> **)((long)__s + -0x18),
                                  *(bool *)((long)__s + -0x10),*(int *)((long)__s + -8));
          *(double *)
           ((long)local_1d88 +
           (long)prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_ * 8 +
           (long)local_1c80 * local_1d90 * 8) = local_1d98;
          if (*(double *)
               ((long)local_1d88 +
               (long)prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_ * 8 +
               (long)local_1c80 * local_1d90 * 8) < _i_5) {
            _i_5 = *(double *)
                    ((long)local_1d88 +
                    (long)prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._4_4_ * 8 +
                    (long)local_1c80 * local_1d90 * 8);
          }
          j_1 = j_1 + 1;
        }
      }
      local_1db8 = (size_type)(int)(local_4c * local_1cf8->num_sc_states);
      local_1ca8 = 0.0;
      local_1db0 = (allocator<double> *)((long)&sum + 7);
      *(undefined8 *)((long)__s + -8) = 0x168b23;
      std::allocator<double>::allocator((allocator<double> *)((long)&sum + 7));
      __a = local_1db0;
      sVar23 = local_1db8;
      *(undefined8 *)((long)__s + -8) = 0x168b44;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_1ca0,sVar23,&local_1ca8,__a);
      *(undefined8 *)((long)__s + -8) = 0x168b52;
      std::allocator<double>::~allocator((allocator<double> *)((long)&sum + 7));
      _j_2 = 0.0;
      for (k = 0; k < (int)local_4c; k = k + 1) {
        for (i_7 = 0; i_7 < local_1cf8->num_sc_states; i_7 = i_7 + 1) {
          j_3 = k * local_1cf8->num_sc_states + i_7;
          dVar1 = *(double *)((long)local_1d88 + (long)i_7 * 8 + (long)k * local_1d90 * 8);
          *(undefined8 *)((long)__s + -8) = 0x168c0b;
          local_1dd0 = pow(2.718281828,(_i_5 - dVar1) * 0.5);
          sVar23 = (size_type)j_3;
          local_1dc8 = (vector<double,_std::allocator<double>_> *)local_1ca0;
          *(undefined8 *)((long)__s + -8) = 0x168c2d;
          pvVar18 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_1ca0,sVar23);
          this_01 = local_1dc8;
          *pvVar18 = local_1dd0;
          sVar23 = (size_type)j_3;
          *(undefined8 *)((long)__s + -8) = 0x168c4c;
          pvVar18 = std::vector<double,_std::allocator<double>_>::operator[](this_01,sVar23);
          dVar1 = *pvVar18;
          *(undefined8 *)((long)__s + -8) = 0x168c55;
          local_1db9 = std::isfinite(dVar1);
          if (!(bool)local_1db9) {
            *(undefined1 **)((long)__s + -8) = &LAB_00168c8a;
            __assert_fail("std::isfinite(prob[k])",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                          ,0x30d,
                          "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                         );
          }
          sVar23 = (size_type)j_3;
          *(undefined8 *)((long)__s + -8) = 0x168ce3;
          pvVar18 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_1ca0,sVar23);
          dVar1 = *pvVar18;
          *(undefined8 *)((long)__s + -8) = 0x168cec;
          uVar15 = std::isinf(dVar1);
          local_1dd1 = (undefined1)uVar15;
          if ((uVar15 & 1) != 0) {
            *(undefined8 *)((long)__s + -8) = 0x168d16;
            poVar19 = std::operator<<((ostream *)&std::cout,
                                      "grow_one_with_sc probability error in state ");
            iVar13 = k;
            local_1de0 = poVar19;
            *(undefined8 *)((long)__s + -8) = 0x168d31;
            poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar13);
            local_1de8 = poVar19;
            *(undefined8 *)((long)__s + -8) = 0x168d4d;
            poVar19 = std::operator<<(poVar19,", ");
            iVar13 = i_7;
            local_1df0 = poVar19;
            *(undefined8 *)((long)__s + -8) = 0x168d68;
            poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar13);
            local_1df8 = poVar19;
            *(undefined8 *)((long)__s + -8) = 0x168d84;
            poVar19 = std::operator<<(poVar19,": ");
            auStack_1e78._120_8_ = poVar19;
            *(undefined8 *)((long)__s + -8) = 0x168da0;
            poVar19 = std::operator<<(poVar19," ");
            dVar1 = *(double *)((long)local_1d88 + (long)i_7 * 8 + (long)k * local_1d90 * 8);
            auStack_1e78._112_8_ = poVar19;
            *(undefined8 *)((long)__s + -8) = 0x168dde;
            poVar19 = (ostream *)std::ostream::operator<<(poVar19,dVar1);
            auStack_1e78._104_8_ = poVar19;
            *(undefined8 *)((long)__s + -8) = 0x168dfa;
            auStack_1e78._96_8_ = std::operator<<(poVar19," ");
            sVar23 = (size_type)j_3;
            *(undefined8 *)((long)__s + -8) = 0x168e16;
            pvVar18 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)local_1ca0,sVar23);
            this_00 = auStack_1e78._96_8_;
            dVar1 = *pvVar18;
            *(undefined8 *)((long)__s + -8) = 0x168e26;
            pvVar20 = (void *)std::ostream::operator<<((void *)this_00,dVar1);
            auStack_1e78._88_8_ = pvVar20;
            *(undefined8 *)((long)__s + -8) = 0x168e42;
            std::ostream::operator<<(pvVar20,std::endl<char,std::char_traits<char>>);
            *(undefined8 *)((long)__s + -8) = 0x168e4b;
            exit(0);
          }
          sVar23 = (size_type)j_3;
          *(undefined8 *)((long)__s + -8) = 0x168e5e;
          pvVar18 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_1ca0,sVar23);
          dVar1 = _j_2 + *pvVar18;
          _j_2 = dVar1;
          *(undefined8 *)((long)__s + -8) = 0x168e83;
          auStack_1e78[0x57] = std::isfinite(dVar1);
          if (!(bool)auStack_1e78[0x57]) {
            *(undefined8 *)((long)__s + -8) = 0x168eb8;
            __assert_fail("std::isfinite(sum)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                          ,0x314,
                          "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                         );
          }
        }
      }
      if (_j_2 <= 1e-10) {
        for (k_1 = 0; k_1 < (int)local_4c; k_1 = k_1 + 1) {
          for (chosen_scalar = 0; chosen_scalar < local_1cf8->num_sc_states;
              chosen_scalar = chosen_scalar + 1) {
            chosen_i = k_1 * local_1cf8->num_sc_states + chosen_scalar;
            sVar23 = (size_type)chosen_i;
            *(undefined8 *)((long)__s + -8) = 0x168f65;
            pvVar18 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)local_1ca0,sVar23);
            *pvVar18 = 1.0;
          }
        }
      }
      *(undefined8 *)((long)__s + -8) = 0x168fa6;
      auStack_1e78._80_4_ = SampleOne((vector<double,_std::allocator<double>_> *)local_1ca0);
      local_1cd8 = (int)auStack_1e78._80_4_ / local_1cf8->num_sc_states;
      chosen_res._4_4_ = (int)auStack_1e78._80_4_ % local_1cf8->num_sc_states;
      chosen_j = auStack_1e78._80_4_;
      if ((_tmpEnd_local->_res[LoopChosen_local]._type == -1) ||
         (_tmpEnd_local->_res[LoopChosen_local]._type == -0x3039)) {
        *(undefined8 *)((long)__s + -8) = 0x16903a;
        poVar19 = std::operator<<((ostream *)&std::cout,"grow_one_bb_only atom type error ");
        auStack_1e78._72_8_ = poVar19;
        *(undefined8 *)((long)__s + -8) = 0x169052;
        pvVar20 = (void *)std::ostream::operator<<(poVar19,LoopChosen_local);
        auStack_1e78._64_8_ = pvVar20;
        *(undefined8 *)((long)__s + -8) = 0x16906e;
        std::ostream::operator<<(pvVar20,std::endl<char,std::char_traits<char>>);
        *(undefined8 *)((long)__s + -8) = 0x169077;
        exit(0);
      }
      pRStack_1ce8 = local_1d58 + (long)local_1cd8 * local_1d60 + (long)chosen_res._4_4_;
      pAVar24 = _tmpEnd_local->_res[LoopChosen_local]._atom;
      *(undefined8 *)((long)__s + -8) = 0x1690ce;
      auStack_1e78._60_4_ = Atom::is_at_origin(pAVar24);
      if (auStack_1e78._60_4_ != 0) {
        *(undefined8 *)((long)__s + -8) = 0x16910b;
        __assert_fail("!CurConf._res[Position]._atom[ATM_N].is_at_origin()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                      ,0x331,
                      "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                     );
      }
      pAVar24 = _tmpEnd_local->_res[LoopChosen_local]._atom;
      *(undefined8 *)((long)__s + -8) = 0x16912b;
      auStack_1e78._56_4_ = Atom::is_at_origin(pAVar24 + 1);
      if (auStack_1e78._56_4_ != 0) {
        *(undefined8 *)((long)__s + -8) = 0x169168;
        __assert_fail("!CurConf._res[Position]._atom[ATM_CA].is_at_origin()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                      ,0x332,
                      "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                     );
      }
      pAVar24 = _tmpEnd_local->_res[LoopChosen_local]._atom;
      *(undefined8 *)((long)__s + -8) = 0x16918b;
      auStack_1e78._52_4_ = Atom::is_at_origin(pAVar24 + 2);
      if (auStack_1e78._52_4_ == 0) {
        *(undefined8 *)((long)__s + -8) = 0x1691bf;
        __assert_fail("CurConf._res[Position]._atom[ATM_C].is_at_origin()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                      ,0x333,
                      "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                     );
      }
      pAVar24 = _tmpEnd_local->_res[LoopChosen_local]._atom;
      *(undefined8 *)((long)__s + -8) = 0x1691e2;
      auStack_1e78._48_4_ = Atom::is_at_origin(pAVar24 + 3);
      if (auStack_1e78._48_4_ == 0) {
        *(undefined8 *)((long)__s + -8) = 0x169216;
        __assert_fail("CurConf._res[Position]._atom[ATM_O].is_at_origin()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                      ,0x334,
                      "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                     );
      }
      pAVar24 = _tmpEnd_local->_res[LoopChosen_local + 1]._atom;
      *(undefined8 *)((long)__s + -8) = 0x169236;
      auStack_1e78._44_4_ = Atom::is_at_origin(pAVar24);
      if (auStack_1e78._44_4_ == 0) {
        *(undefined8 *)((long)__s + -8) = 0x16926a;
        __assert_fail("CurConf._res[Position + 1]._atom[ATM_N].is_at_origin()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                      ,0x335,
                      "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                     );
      }
      pAVar24 = _tmpEnd_local->_res[LoopChosen_local + 1]._atom;
      *(undefined8 *)((long)__s + -8) = 0x16928e;
      auStack_1e78._40_4_ = Atom::is_at_origin(pAVar24 + 1);
      iVar13 = chosen_j;
      pRVar22 = pRStack_1ce8;
      if (auStack_1e78._40_4_ == 0) {
        *(undefined8 *)((long)__s + -8) = 0x1692c2;
        __assert_fail("CurConf._res[Position + 1]._atom[ATM_CA].is_at_origin()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                      ,0x336,
                      "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                     );
      }
      puVar25 = &local_1cf8->field_0xe3498;
      pvVar21 = &local_1cf8->starts;
      pvVar28 = &local_1cf8->ends;
      *(int *)((long)__s + -8) = EndPt_local._4_4_;
      *(int *)((long)__s + -0x10) = LoopChosen_local;
      *(undefined8 *)((long)__s + -0x18) = 0x169310;
      PotentialFrontend::on_grow_one_res_chosen
                ((PotentialFrontend *)puVar25,_tmpEnd_local,pRVar22,iVar13,pvVar21,pvVar28,
                 *(int *)((long)__s + -0x10),*(int *)((long)__s + -8));
      pAVar24 = _tmpEnd_local->_res[LoopChosen_local]._atom;
      pAVar27 = pRStack_1ce8->_atom;
      *(undefined8 *)((long)__s + -8) = 0x16934a;
      Atom::CopyPos(pAVar24 + 2,pAVar27 + 2);
      pAVar24 = _tmpEnd_local->_res[LoopChosen_local]._atom;
      pAVar27 = pRStack_1ce8->_atom;
      *(undefined8 *)((long)__s + -8) = 0x169380;
      Atom::CopyPos(pAVar24 + 3,pAVar27 + 3);
      pAVar24 = _tmpEnd_local->_res[LoopChosen_local + 1]._atom;
      pAVar27 = pRStack_1ce8->_atom;
      *(undefined8 *)((long)__s + -8) = 0x1693ac;
      Atom::CopyPos(pAVar24,pAVar27);
      pAVar24 = _tmpEnd_local->_res[LoopChosen_local + 1]._atom;
      pAVar27 = pRStack_1ce8->_atom;
      *(undefined8 *)((long)__s + -8) = 0x1693e0;
      Atom::CopyPos(pAVar24 + 1,pAVar27 + 1);
      if (_tmpEnd_local->_res[LoopChosen_local]._type != 5) {
        pAVar24 = _tmpEnd_local->_res[LoopChosen_local]._atom;
        *(undefined8 *)((long)__s + -8) = 0x169428;
        auStack_1e78._36_4_ = Atom::is_at_origin(pAVar24 + 5);
        if (auStack_1e78._36_4_ == 0) {
          *(undefined8 *)((long)__s + -8) = 0x16945c;
          __assert_fail("CurConf._res[Position]._atom[ATM_CB].is_at_origin()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                        ,0x347,
                        "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                       );
        }
        pAVar24 = _tmpEnd_local->_res[LoopChosen_local]._atom;
        pAVar27 = pRStack_1ce8->_atom;
        *(undefined8 *)((long)__s + -8) = 0x169490;
        Atom::CopyPos(pAVar24 + 5,pAVar27 + 5);
        if (pRStack_1ce8->_numAtom != _tmpEnd_local->_res[LoopChosen_local]._numAtom) {
          *(undefined8 *)((long)__s + -8) = 0x1694dc;
          __assert_fail("chosen_res._numAtom == CurConf._res[Position]._numAtom",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                        ,0x34b,
                        "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                       );
        }
        for (local_1cec = 6; local_1cec < _tmpEnd_local->_res[LoopChosen_local]._numAtom;
            local_1cec = local_1cec + 1) {
          pAVar24 = _tmpEnd_local->_res[LoopChosen_local]._atom;
          lVar17 = (long)local_1cec;
          pAVar27 = pRStack_1ce8->_atom;
          *(undefined8 *)((long)__s + -8) = 0x169545;
          Atom::CopyPos(pAVar24 + lVar17,pAVar27 + lVar17);
        }
      }
      pRVar22 = _tmpEnd_local->_res;
      *(undefined8 *)((long)__s + -8) = 0x169579;
      Structure::SinglecalCenter(_tmpEnd_local,pRVar22 + LoopChosen_local,0);
      this_local._7_1_ = 1;
      *(undefined8 *)((long)__s + -8) = 0x169595;
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_1ca0);
      auStack_1e78._24_8_ = local_1d58 + local_1d68 * local_1d60;
      if (local_1d58 != (Residue *)auStack_1e78._24_8_) {
        do {
          pRVar22 = (Residue *)(auStack_1e78._24_8_ + -0x150);
          auStack_1e78._16_8_ = pRVar22;
          *(undefined8 *)((long)__s + -8) = 0x1695e1;
          Residue::~Residue(pRVar22);
          auStack_1e78._24_8_ = auStack_1e78._16_8_;
        } while ((Residue *)auStack_1e78._16_8_ != local_1d58);
      }
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool SMC::grow_one_with_sc(Structure &CurConf, const int Position, const int tmpEnd, const int LoopChosen,
                           const Atom &EndPt) {

    // Initialize positional values
    int phi_int, psi_int;

    // Initialize numbers of backbone states
    const int NumBBStates = this->num_dist_states;

    // The current residue
    const int CurResType = CurConf._res[Position]._type;

    // Placeholders for sampling
    DECLARE_VLA_2D(double, bb_angles, NumBBStates, 3);

    const int binNum = 180 / BBTbinSize;
    const double EEdisC = CurConf._res[Position]._atom[ATM_CA].dis(EndPt);
    double EEdisN = 0;

    const int RemLength = tmpEnd - Position;
    const double minEEDisC = minDistcon[1][RemLength];
    const double maxEEDisC = minDistcon[1][RemLength] + 31 * DistconBy[1][RemLength];
    const double minEEDisN = minDistcon[0][RemLength - 1];
    const double maxEEDisN = minDistcon[0][RemLength - 1] + 31 * DistconBy[0][RemLength - 1];
    
    int num_dead_labels = 0;

    /////////////////////////////////////////////////////////////////
    // Sample end-to-end distances and convert to positions.
    // End-to-end distances are sampled from an empirical distribution
    /////////////////////////////////////////////////////////////////

    // Early out if distance constraints are not satisfied
    // for carbon atom
    if (EEdisC < minEEDisC || EEdisC > maxEEDisC) {
        return false;
    }

    // BEGIN LargeNumDistanceStates scope
    {
        const int LargeNumDistanceStates = 160;
        DECLARE_VLA_2D(double, larbb_angles, LargeNumDistanceStates, 3);

        DECLARE_VLA_1D(int, Phi, LargeNumDistanceStates);
        DECLARE_VLA_1D(int, Psi, LargeNumDistanceStates);
        DECLARE_VLA_1D(int, TorProb, LargeNumDistanceStates);
        DECLARE_VLA_1D(int, deadlabel, LargeNumDistanceStates);

        SET_VLA_1D(int, deadlabel, LargeNumDistanceStates, 0);

        // Loop through states
        for (int i = 0; i < LargeNumDistanceStates; i++) {
            // Initialize four residues for this sample
            Residue sam;
            // Sample new points for C atom based on distance to final C
            TorProb[i] = -1;

            // Sample carbon atom
            sample_distance(CurConf._res[Position]._atom[ATM_N],
                            CurConf._res[Position]._atom[ATM_CA],
                            EndPt,
                            Residue::bond_angle[CurResType][ATM_C],
                            Residue::bond_length[CurResType][ATM_C],
                            sam._atom[ATM_C], EEdisC,
                            1, RemLength);

            // Skip if sampling failed (and try again)
            if (conditional_mark_dead_label(sam._atom[ATM_C].x, TorProb[i], deadlabel[i], num_dead_labels)) {
                continue;
            }

            // Sample new points for N atom based on distance to final C
            EEdisN = sam._atom[ATM_C].dis(EndPt);
            if (EEdisN >= minEEDisN && EEdisN <= maxEEDisN) {
                sample_distance(CurConf._res[Position]._atom[ATM_CA],
                                sam._atom[ATM_C],
                                EndPt,
                                Residue::bond_angle[CurResType][ATM_N],
                                Residue::bond_length[CurResType][ATM_N],
                                sam._atom[ATM_N], EEdisN,
                                // -1 since it's NEXT N
                                0, RemLength - 1);
            }
            else {
                TorProb[i] = 0;
                deadlabel[i] = 1;
                ++num_dead_labels;
                continue;
            }

            if (conditional_mark_dead_label(sam._atom[ATM_N].x, TorProb[i], deadlabel[i], num_dead_labels)) {
                continue;
            }

            // Populate remainder of bb_angles with the torsion angles
            // implied by the positional selections for C and N. This is for
            // unity with the existing code base. Omega = pi by default.
            // Note: PI/180 converts from degrees to radians
            larbb_angles[i][eix_phi] =
                    torsion(CurConf._res[Position - 1]._atom[ATM_C],
                            CurConf._res[Position]._atom[ATM_N],
                            CurConf._res[Position]._atom[ATM_CA],
                            sam._atom[ATM_C], torsion_degrees);
            larbb_angles[i][eix_psi] =
                    torsion(CurConf._res[Position]._atom[ATM_N],
                            CurConf._res[Position]._atom[ATM_CA],
                            sam._atom[ATM_C],
                            sam._atom[ATM_N], torsion_degrees);
            // Sample omega (peptide bond) angle from normal distribution
            box_MullerNsample_single(larbb_angles[i][eix_omega], PI, TO_RAD(4));

            // Box muller can return NaN because frand(0,1) can return value > 1 which
            // causes a negative log. This is due to weird FRAND padding with +0.5.
            // The fix is to use the <random> library which handles interval sampling properly.
            conditional_mark_dead_label(larbb_angles[i][eix_omega], TorProb[i], deadlabel[i], num_dead_labels);
        }

        // need to check if all are dead as could infinite loop forever
        if (num_dead_labels == LargeNumDistanceStates) {
            return false;
        }

        /////////////////////////////////////////////////////////////////
        // Of the candidates sampled from end-to-end distance distribution,
        //  select a subset of the generated candidates according to empirical
        //  phi, psi distribution.
        /////////////////////////////////////////////////////////////////

        // Typically, we now have LargeNumDistanceStates # of candidates
        // which have phi, psi torsion angles as determined by sampling
        // from empirical distance distribution. The next step is to select
        // a subset of the candidates (specifically a subset of size
        // NumStates) according to the empirical joint distribution of
        // phi, psi angles for the current residue being grown.
        {
            // @TODO - factor this out into a function, it's a bit
            // tricky because of the VLA arrays, but the best candidate
            // refactoring would be Method-to-Class where local variables
            // become the class variables

            int Total = 0;
            // This loop tallies up how many instances of the discretized
            // (phi, psi) pair have been observed. "TorProb" is actually a
            // misnomer (but effectively functions the same way when combined
            // with "Total" variable) as it is actually an observation count
            // and not a normalized probability.
            for (int i = 0; i < LargeNumDistanceStates; ++i) {

                if (TorProb[i] == -1) {
                    phi_int = (int)(larbb_angles[i][eix_phi] / BBTbinSize) + binNum;
                    psi_int = (int)(larbb_angles[i][eix_psi] / BBTbinSize) + binNum;

                    if (larbb_angles[i][eix_phi] / BBTbinSize + binNum - phi_int < 0)
                        --phi_int;
                    if (larbb_angles[i][eix_psi] / BBTbinSize + binNum - psi_int < 0)
                        --psi_int;
                    Phi[i] = phi_int;
                    Psi[i] = psi_int;

                    TorProb[i] = Joint_Angle[CurResType][phi_int][psi_int];
                    Total += TorProb[i];
                }
            }

            // Check if rotamer library usage has been enabled. The phi, psi
            // backbone libraries are histograms with observed phi, psi counts
            // for a training set of several thousand (~10k) loop samples.
            // However, the histograms have not been smoothed and therefore are
            // somewhat sparse and can make it hard to generate clash free loops.
            // In practice, using the rotamer libraries may lead to loop samples
            // with better RMSD to target structures - but with a cost of potentially
            // higher Lennard Jones potential energy.

            // Now actually select a smaller subset of candidates based on empirical
            // (phi, psi) distribution:
            if ((0 == Total) || !use_rot_lib) {
                for (int i = 0; i < NumBBStates; ++i) {
                    // @TODO - use actual uniform distribution
                    int r = rand() % LargeNumDistanceStates;
                    // Skip to next valid sampled state
                    while (1 == deadlabel[r])
                        r = ((r + 1) % LargeNumDistanceStates);

                    bb_angles[i][eix_phi] = frand((double)((Phi[r] - binNum) * PI / binNum),
                        (double)((Phi[r] - binNum + 1) * PI / binNum));
                    bb_angles[i][eix_psi] = frand((double)((Psi[r] - binNum) * PI / binNum),
                        (double)((Psi[r] - binNum + 1) * PI / binNum));
                    bb_angles[i][eix_omega] = larbb_angles[r][eix_omega];
                    continue;
                }
            }
            else {
                for (int i = 0; i < NumBBStates; ++i) {
                    // Select a random bin
                    int r = rand() % Total;
                    int cur = 0;
                    for (int j = 0; j < LargeNumDistanceStates; j++) {
                        cur += TorProb[j];
                        if (r < cur) {
                            // Select a random set of torsion angles within selected bin
                            bb_angles[i][eix_phi] = frand((double) ((Phi[j] - binNum) * PI / binNum),
                                                    (double) ((Phi[j] - binNum + 1) * PI / binNum));
                            bb_angles[i][eix_psi] = frand((double) ((Psi[j] - binNum) * PI / binNum),
                                                    (double) ((Psi[j] - binNum + 1) * PI / binNum));
                            bb_angles[i][eix_omega] = larbb_angles[j][eix_omega];
                            break;
                        }
                    }
                }
            }
        } // end select subset of backbone angles
    }